

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileReader.h
# Opt level: O0

void __thiscall bwtil::FileReader::FileReader(FileReader *this,string *path)

{
  ifstream *this_00;
  char *pcVar1;
  streamoff sVar2;
  long *in_RDI;
  streampos end;
  streampos begin;
  fpos<__mbstate_t> local_40;
  fpos<__mbstate_t> local_30 [3];
  
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  this_00 = (ifstream *)operator_new(0x208);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(this_00,pcVar1,_S_bin);
  *in_RDI = (long)this_00;
  std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)0x104daf);
  std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)0x104db9);
  local_30[0] = (fpos<__mbstate_t>)std::istream::tellg();
  std::istream::seekg(*in_RDI,_S_beg);
  local_40 = (fpos<__mbstate_t>)std::istream::tellg();
  std::istream::seekg(*in_RDI,_S_beg);
  sVar2 = std::fpos<__mbstate_t>::operator-(&local_40,local_30);
  in_RDI[1] = sVar2;
  in_RDI[2] = 0;
  return;
}

Assistant:

FileReader(string path){

		fs = new ifstream(path.c_str(), ios::binary);

		streampos begin,end;
		begin = fs->tellg();
		fs->seekg (0, ios::end);
		end = fs->tellg();
		fs->seekg (0, ios::beg);

		n=end-begin;
		pos=0;

	}